

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  int iVar1;
  element_type *peVar2;
  ulong uVar3;
  string *text;
  ScopedElement *pSVar4;
  long in_RSI;
  long in_RDI;
  ScopedElement e;
  TestCaseStats *in_stack_fffffffffffffe38;
  StreamingReporterBase<Catch::XmlReporter> *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  ScopedElement *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  XmlWriter *in_stack_fffffffffffffe68;
  XmlFormatting fmt;
  XmlWriter *in_stack_fffffffffffffe70;
  string local_160 [39];
  undefined1 local_139 [49];
  string local_108 [39];
  undefined1 local_e1 [49];
  XmlWriter *local_b0;
  undefined1 local_a1 [41];
  string local_78 [55];
  allocator local_41;
  string local_40 [48];
  long local_10;
  
  local_10 = in_RSI;
  StreamingReporterBase<Catch::XmlReporter>::testCaseEnded
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"OverallResult",&local_41);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             (XmlFormatting)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"success",(allocator *)(local_a1 + 0x28));
  local_a1[0x27] = Counts::allOk((Counts *)(local_10 + 0xc0));
  XmlWriter::ScopedElement::writeAttribute<bool>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(bool *)in_stack_fffffffffffffe40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)(local_a1 + 0x28));
  peVar2 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x157c44);
  iVar1 = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar1 == 1) {
    in_stack_fffffffffffffe70 = (XmlWriter *)local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_a1 + 1),"durationInSeconds",(allocator *)in_stack_fffffffffffffe70);
    in_stack_fffffffffffffe68 = (XmlWriter *)Timer::getElapsedSeconds((Timer *)0x157ca1);
    local_b0 = in_stack_fffffffffffffe68;
    XmlWriter::ScopedElement::writeAttribute<double>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (double *)in_stack_fffffffffffffe40);
    std::__cxx11::string::~string((string *)(local_a1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a1);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    in_stack_fffffffffffffe58 = (string *)(in_RDI + 0x170);
    in_stack_fffffffffffffe60 = (string *)local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_e1 + 1),"StdOut",(allocator *)in_stack_fffffffffffffe60);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
               (XmlFormatting)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    trim(in_stack_fffffffffffffe58);
    XmlWriter::ScopedElement::writeText
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (XmlFormatting)((ulong)in_stack_fffffffffffffe40 >> 0x20));
    std::__cxx11::string::~string(local_108);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe40);
    std::__cxx11::string::~string((string *)(local_e1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_e1);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    text = (string *)(in_RDI + 0x170);
    pSVar4 = (ScopedElement *)local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_139 + 1),"StdErr",(allocator *)pSVar4);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
               (XmlFormatting)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    trim(in_stack_fffffffffffffe58);
    XmlWriter::ScopedElement::writeText
              (pSVar4,text,(XmlFormatting)((ulong)in_stack_fffffffffffffe40 >> 0x20));
    std::__cxx11::string::~string(local_160);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe40);
    std::__cxx11::string::~string((string *)(local_139 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_139);
  }
  fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  pSVar4 = (ScopedElement *)(in_RDI + 0x170);
  operator|(Newline,Indent);
  XmlWriter::endElement(in_stack_fffffffffffffe70,fmt);
  XmlWriter::ScopedElement::~ScopedElement(pSVar4);
  return;
}

Assistant:

void XmlReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        StreamingReporterBase::testCaseEnded( testCaseStats );
        XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
        e.writeAttribute( "success", testCaseStats.totals.assertions.allOk() );

        if ( m_config->showDurations() == ShowDurations::Always )
            e.writeAttribute( "durationInSeconds", m_testCaseTimer.getElapsedSeconds() );

        if( !testCaseStats.stdOut.empty() )
            m_xml.scopedElement( "StdOut" ).writeText( trim( testCaseStats.stdOut ), XmlFormatting::Newline );
        if( !testCaseStats.stdErr.empty() )
            m_xml.scopedElement( "StdErr" ).writeText( trim( testCaseStats.stdErr ), XmlFormatting::Newline );

        m_xml.endElement();
    }